

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprMightBeIndexed2(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr)

{
  undefined4 uVar1;
  int iVar2;
  Expr *in_RCX;
  Expr *in_RDX;
  ulong in_RSI;
  long in_RDI;
  int iCur;
  int i;
  Index *pIdx;
  int local_34;
  long lVar3;
  ulong local_18;
  
  local_34 = 0;
  for (local_18 = in_RSI; 1 < local_18; local_18 = local_18 >> 1) {
    local_34 = local_34 + 1;
  }
  uVar1 = *(undefined4 *)(in_RDI + (long)local_34 * 0x70 + 0x48);
  lVar3 = *(long *)(*(long *)(in_RDI + (long)local_34 * 0x70 + 0x28) + 0x10);
  do {
    if (lVar3 == 0) {
      return 0;
    }
    if (*(long *)(lVar3 + 0x50) != 0) {
      for (local_34 = 0; local_34 < (int)(uint)*(ushort *)(lVar3 + 0x5e); local_34 = local_34 + 1) {
        if ((*(short *)(*(long *)(lVar3 + 8) + (long)local_34 * 2) == -2) &&
           (iVar2 = sqlite3ExprCompareSkip(in_RDX,in_RCX,(int)((ulong)lVar3 >> 0x20)), iVar2 == 0))
        {
          in_RDX->op = (char)uVar1;
          in_RDX->affinity = (char)((uint)uVar1 >> 8);
          *(short *)&in_RDX->field_0x2 = (short)((uint)uVar1 >> 0x10);
          in_RDX->flags = 0xfffffffe;
          return 1;
        }
      }
    }
    lVar3 = *(long *)(lVar3 + 0x28);
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int exprMightBeIndexed2(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor and column here */
  Expr *pExpr            /* An operand of a comparison operator */
){
  Index *pIdx;
  int i;
  int iCur;
  for(i=0; mPrereq>1; i++, mPrereq>>=1){}
  iCur = pFrom->a[i].iCursor;
  for(pIdx=pFrom->a[i].pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->aColExpr==0 ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
      if( sqlite3ExprCompareSkip(pExpr, pIdx->aColExpr->a[i].pExpr, iCur)==0 ){
        aiCurCol[0] = iCur;
        aiCurCol[1] = XN_EXPR;
        return 1;
      }
    }
  }
  return 0;
}